

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field_Zp.h
# Opt level: O0

int __thiscall Gudhi::persistent_cohomology::Field_Zp::init(Field_Zp *this,EVP_PKEY_CTX *ctx)

{
  invalid_argument *piVar1;
  int local_34;
  value_type_conflict1 local_30;
  int mult;
  int inv;
  int i;
  int local_14;
  Field_Zp *pFStack_10;
  int charac_local;
  Field_Zp *this_local;
  
  local_14 = (int)ctx;
  this->Prime = local_14;
  pFStack_10 = this;
  if (0xb501 < this->Prime) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar1,"Maximum homology_coeff_field allowed value is 46337");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->Prime < 2) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"homology_coeff_field must be a prime number");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<int,_std::allocator<int>_>::clear(&this->inverse_);
  std::vector<int,_std::allocator<int>_>::reserve(&this->inverse_,(long)local_14);
  inv = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&this->inverse_,&inv);
  mult = 1;
  do {
    if (this->Prime <= mult) {
      return mult;
    }
    local_30 = 1;
    local_34 = mult;
    while (local_34 % this->Prime != 1) {
      local_30 = local_30 + 1;
      if (local_34 == this->Prime) {
        piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar1,"homology_coeff_field must be a prime number");
        __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_34 = local_30 * mult;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->inverse_,&local_30);
    mult = mult + 1;
  } while( true );
}

Assistant:

void init(int charac) {
    Prime = charac;

    // Check that the provided prime is less than the maximum allowed as int, calculation below, and 'plus_times_equal' function : 46337 ; i.e (max_prime-1)*max_prime <= INT_MAX
    if(Prime > 46337)
        throw std::invalid_argument("Maximum homology_coeff_field allowed value is 46337");

    // Check for primality
    if (Prime <= 1)
        throw std::invalid_argument("homology_coeff_field must be a prime number");

    inverse_.clear();
    inverse_.reserve(charac);
    inverse_.push_back(0);
    for (int i = 1; i < Prime; ++i) {
      int inv = 1;
      int mult = inv * i;
      while ( (mult % Prime) != 1) {
        ++inv;
        if(mult == Prime)
            throw std::invalid_argument("homology_coeff_field must be a prime number");
        mult = inv * i;
      }
      inverse_.push_back(inv);
    }
  }